

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void randomFunc(sqlite3_context *context,int NotUsed,sqlite3_value **NotUsed2)

{
  ulong in_RAX;
  ulong uVar1;
  sqlite_int64 r;
  ulong local_18;
  
  local_18 = in_RAX;
  sqlite3_randomness(8,&local_18);
  uVar1 = -(local_18 & 0x7fffffffffffffff);
  if (-1 < (long)local_18) {
    uVar1 = local_18;
  }
  sqlite3VdbeMemRelease(&context->s);
  (context->s).u.i = uVar1;
  (context->s).flags = 4;
  (context->s).type = '\x01';
  return;
}

Assistant:

static void randomFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **NotUsed2
){
  sqlite_int64 r;
  UNUSED_PARAMETER2(NotUsed, NotUsed2);
  sqlite3_randomness(sizeof(r), &r);
  if( r<0 ){
    /* We need to prevent a random number of 0x8000000000000000 
    ** (or -9223372036854775808) since when you do abs() of that
    ** number of you get the same value back again.  To do this
    ** in a way that is testable, mask the sign bit off of negative
    ** values, resulting in a positive value.  Then take the 
    ** 2s complement of that positive value.  The end result can
    ** therefore be no less than -9223372036854775807.
    */
    r = -(r & LARGEST_INT64);
  }
  sqlite3_result_int64(context, r);
}